

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTruth.c
# Opt level: O1

Vec_Mem_t * If_DeriveHashTable6(int nVars,word uTruth)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  Vec_Mem_t *p;
  Vec_Int_t *pVVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  word tCur;
  ulong local_78;
  ulong local_70;
  int *local_68;
  int *local_60;
  word local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar3 = 1 << ((byte)nVars & 0x1f);
  local_58 = uTruth;
  uVar4 = Extra_Factorial(nVars);
  piVar6 = Extra_GreyCodeSchedule(nVars);
  local_68 = Extra_PermSchedule(nVars);
  iVar9 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    iVar9 = 1;
  }
  local_40 = (ulong)(uint)nVars;
  p = (Vec_Mem_t *)calloc(1,0x30);
  p->nEntrySize = iVar9;
  p->LogPageSze = 0xc;
  p->PageMask = 0xfff;
  p->iPage = -1;
  if ((p->vTable != (Vec_Int_t *)0x0) || (p->vNexts != (Vec_Int_t *)0x0)) {
    __assert_fail("p->vTable == NULL && p->vNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                  ,0x13b,"void Vec_MemHashAlloc(Vec_Mem_t *, int)");
  }
  uVar11 = 9999;
  while( true ) {
    do {
      uVar10 = uVar11;
      uVar11 = uVar10 + 1;
    } while ((uVar10 & 1) != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while (uVar11 % (iVar9 - 2U) != 0) {
      uVar5 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar5) goto LAB_00438be1;
    }
  }
LAB_00438be1:
  local_60 = piVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar10) {
    uVar5 = uVar11;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar5;
  piVar6 = (int *)malloc((long)(int)uVar5 << 2);
  pVVar7->pArray = piVar6;
  pVVar7->nSize = uVar11;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0xff,(long)(int)uVar11 << 2);
  }
  p->vTable = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(40000);
  pVVar7->pArray = piVar6;
  p->vNexts = pVVar7;
  uVar13 = 1;
  if (1 < (int)uVar3) {
    uVar13 = (ulong)uVar3;
  }
  local_48 = (ulong)uVar4;
  lVar8 = 0;
  do {
    uVar12 = -lVar8 ^ local_58;
    local_70 = uVar12;
    local_50 = lVar8;
    if (0 < (int)uVar4) {
      uVar14 = 0;
      do {
        piVar6 = local_60;
        local_78 = uVar12;
        local_38 = uVar14;
        if ((int)local_40 != 0x1f) {
          uVar14 = 0;
          do {
            uVar2 = local_78;
            Vec_MemHashInsert(p,&local_78);
            bVar1 = (byte)(1L << ((byte)piVar6[uVar14] & 0x3f));
            local_78 = (s_Truths6[piVar6[uVar14]] & uVar2) >> (bVar1 & 0x3f) |
                       uVar2 << (bVar1 & 0x3f) & s_Truths6[piVar6[uVar14]];
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        if (uVar12 != local_78) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                        ,0x171,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
        }
        iVar9 = local_68[local_38];
        bVar1 = (byte)(1L << ((byte)iVar9 & 0x3f));
        uVar12 = (local_78 & s_PMasks[iVar9][2]) >> (bVar1 & 0x3f) |
                 (s_PMasks[iVar9][1] & local_78) << (bVar1 & 0x3f) | s_PMasks[iVar9][0] & local_78;
        uVar14 = local_38 + 1;
      } while (uVar14 != local_48);
    }
    local_78 = uVar12;
    if (local_70 != uVar12) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTruth.c"
                    ,0x174,"Vec_Mem_t *If_DeriveHashTable6(int, word)");
    }
    lVar8 = local_50 + 1;
  } while (local_50 == 0);
  if (local_60 != (int *)0x0) {
    free(local_60);
  }
  if (local_68 != (int *)0x0) {
    free(local_68);
  }
  return p;
}

Assistant:

Vec_Mem_t * If_DeriveHashTable6( int nVars, word uTruth )
{
    int fVerbose = 0;
    int nMints   = (1 << nVars);
    int nPerms   = Extra_Factorial( nVars );
    int * pComp  = Extra_GreyCodeSchedule( nVars );
    int * pPerm  = Extra_PermSchedule( nVars );
    word Canon   = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    word tCur, tTemp1, tTemp2;
    Vec_Mem_t * vTtMem6 = Vec_MemAllocForTTSimple( nVars );
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( Canon > tCur )
                    Canon = tCur;
                Vec_MemHashInsert( vTtMem6, &tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    if ( fVerbose )
    {
/*
        word * pEntry;
        Vec_MemForEachEntry( vTtMem6, pEntry, i )
        {
            Extra_PrintHex( stdout, (unsigned*)pEntry, nVars );  
            printf( ", " );
            if ( i % 4 == 3 )
                printf( "\n" );
        }
*/
        Extra_PrintHex( stdout, (unsigned*)&uTruth, nVars );  printf( "\n" );
        Extra_PrintHex( stdout, (unsigned*)&Canon,  nVars );  printf( "\n" );
        printf( "Members = %d.\n", Vec_MemEntryNum(vTtMem6) );
    }
    return vTtMem6;
}